

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageColorBrightness(Image *image,int brightness)

{
  int newFormat;
  Image image_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Color *pCVar5;
  undefined8 in_stack_ffffffffffffffc0;
  int local_34;
  int format;
  int cB;
  int cG;
  int cR;
  int x;
  int y;
  Color *pixels;
  int brightness_local;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pixels._4_4_ = brightness;
    if (brightness < -0xff) {
      pixels._4_4_ = -0xff;
    }
    if (0xff < pixels._4_4_) {
      pixels._4_4_ = 0xff;
    }
    uVar1 = image->width;
    uVar2 = image->height;
    uVar3 = image->mipmaps;
    uVar4 = image->format;
    image_00.height = uVar4;
    image_00.width = uVar3;
    image_00.data._4_4_ = uVar2;
    image_00.data._0_4_ = uVar1;
    image_00._16_8_ = in_stack_ffffffffffffffc0;
    pCVar5 = LoadImageColors(image_00);
    for (cR = 0; cR < image->height; cR = cR + 1) {
      for (cG = 0; cG < image->width; cG = cG + 1) {
        cB = (uint)pCVar5[cR * image->width + cG].r + pixels._4_4_;
        format = (uint)pCVar5[cR * image->width + cG].g + pixels._4_4_;
        local_34 = (uint)pCVar5[cR * image->width + cG].b + pixels._4_4_;
        if (cB < 0) {
          cB = 1;
        }
        if (0xff < cB) {
          cB = 0xff;
        }
        if (format < 0) {
          format = 1;
        }
        if (0xff < format) {
          format = 0xff;
        }
        if (local_34 < 0) {
          local_34 = 1;
        }
        if (0xff < local_34) {
          local_34 = 0xff;
        }
        pCVar5[cR * image->width + cG].r = (uchar)cB;
        pCVar5[cR * image->width + cG].g = (uchar)format;
        pCVar5[cR * image->width + cG].b = (uchar)local_34;
      }
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,newFormat);
  }
  return;
}

Assistant:

void ImageColorBrightness(Image *image, int brightness)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (brightness < -255) brightness = -255;
    if (brightness > 255) brightness = 255;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int cR = pixels[y*image->width + x].r + brightness;
            int cG = pixels[y*image->width + x].g + brightness;
            int cB = pixels[y*image->width + x].b + brightness;

            if (cR < 0) cR = 1;
            if (cR > 255) cR = 255;

            if (cG < 0) cG = 1;
            if (cG > 255) cG = 255;

            if (cB < 0) cB = 1;
            if (cB > 255) cB = 255;

            pixels[y*image->width + x].r = (unsigned char)cR;
            pixels[y*image->width + x].g = (unsigned char)cG;
            pixels[y*image->width + x].b = (unsigned char)cB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}